

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int close_get_error(CLOSE_HANDLE close,ERROR_HANDLE *error_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  uint32_t local_1c;
  
  if (close == (CLOSE_HANDLE)0x0) {
    iVar3 = 0x2731;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(close->composite_value,&local_1c);
    iVar3 = 0x2739;
    if (iVar1 == 0) {
      if (local_1c == 0) {
        iVar3 = 0x273f;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(close->composite_value,0);
        iVar3 = 0x2747;
        if ((value != (AMQP_VALUE)0x0) &&
           (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)) {
          iVar1 = amqpvalue_get_error(value,error_value);
          iVar3 = 0x274e;
          if (iVar1 == 0) {
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int close_get_error(CLOSE_HANDLE close, ERROR_HANDLE* error_value)
{
    int result;

    if (close == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        CLOSE_INSTANCE* close_instance = (CLOSE_INSTANCE*)close;
        if (amqpvalue_get_composite_item_count(close_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(close_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_error(item_value, error_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}